

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ClassMethodDeclarationSyntax::setChild
          (ClassMethodDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  FunctionDeclarationSyntax *pFVar5;
  
  ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  pSVar1 = *ppSVar4;
  if (index == 2) {
    if (pSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pFVar5 = (FunctionDeclarationSyntax *)0x0;
    }
    else {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pFVar5 = (FunctionDeclarationSyntax *)*ppSVar4;
    }
    (this->declaration).ptr = pFVar5;
  }
  else if (index == 1) {
    (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar1->previewNode;
    uVar3 = *(undefined4 *)&pSVar1->field_0x4;
    pSVar2 = pSVar1->parent;
    (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind = pSVar1->kind;
    *(undefined4 *)&(this->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
    (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
    (this->qualifiers).super_SyntaxListBase.childCount = *(size_t *)(pSVar1 + 1);
    pSVar2 = pSVar1[1].previewNode;
    (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar1[1].parent;
    (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar2;
  }
  else {
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
         pSVar1->previewNode;
    uVar3 = *(undefined4 *)&pSVar1->field_0x4;
    pSVar2 = pSVar1->parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = pSVar1->kind;
    *(undefined4 *)
     &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount = *(size_t *)(pSVar1 + 1);
    pSVar2 = pSVar1[1].previewNode;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar1[1].parent;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar2;
  }
  return;
}

Assistant:

void ClassMethodDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: qualifiers = child.node()->as<TokenList>(); return;
        case 2: declaration = child.node() ? &child.node()->as<FunctionDeclarationSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}